

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT> *
wasm::WATParser::maybeTypeidx<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
           *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  optional<unsigned_int> oVar1;
  bool bVar2;
  Name *pNVar3;
  uint *puVar4;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT> local_128;
  uint local_fc;
  Err local_f8;
  Err *local_d8;
  Err *err;
  Result<unsigned_int> _val;
  undefined1 local_98 [8];
  Result<unsigned_int> idx;
  optional<wasm::Name> id;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT> local_48;
  _Optional_payload_base<unsigned_int> local_20;
  optional<unsigned_int> x;
  ParseModuleTypesCtx *ctx_local;
  
  x.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_base<unsigned_int,_true,_true>)(_Optional_base<unsigned_int,_true,_true>)ctx;
  local_20 = (_Optional_payload_base<unsigned_int>)Lexer::takeU32(&ctx->in);
  bVar2 = std::optional::operator_cast_to_bool((optional *)&local_20);
  oVar1 = x;
  if (bVar2) {
    puVar4 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_20);
    ParseModuleTypesCtx::getHeapTypeFromIdx
              (&local_48,
               (ParseModuleTypesCtx *)
               oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>,*puVar4);
    MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>::
    MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
              (__return_storage_ptr__,&local_48);
    Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>::~Result
              (&local_48);
  }
  else {
    Lexer::takeID((optional<wasm::Name> *)
                  ((long)&idx.val.super__Variant_base<unsigned_int,_wasm::Err>.
                          super__Move_assign_alias<unsigned_int,_wasm::Err>.
                          super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                          super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                          super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),
                  (Lexer *)((long)x.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                  super__Optional_payload_base<unsigned_int> + 8));
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional *)
                       ((long)&idx.val.super__Variant_base<unsigned_int,_wasm::Err>.
                               super__Move_assign_alias<unsigned_int,_wasm::Err>.
                               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                               super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
    oVar1 = x;
    if (bVar2) {
      pNVar3 = std::optional<wasm::Name>::operator*
                         ((optional<wasm::Name> *)
                          ((long)&idx.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                  super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                  super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                  super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                  super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
      _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ =
           (pNVar3->super_IString).str._M_len;
      TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::getTypeIndex
                ((Result<unsigned_int> *)local_98,
                 (TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx> *)
                 oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>,(Name)(pNVar3->super_IString).str);
      Result<unsigned_int>::Result((Result<unsigned_int> *)&err,(Result<unsigned_int> *)local_98);
      local_d8 = Result<unsigned_int>::getErr((Result<unsigned_int> *)&err);
      bVar2 = local_d8 != (Err *)0x0;
      if (bVar2) {
        wasm::Err::Err(&local_f8,local_d8);
        MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
        ::MaybeResult(__return_storage_ptr__,&local_f8);
        wasm::Err::~Err(&local_f8);
      }
      local_fc = (uint)bVar2;
      Result<unsigned_int>::~Result((Result<unsigned_int> *)&err);
      oVar1 = x;
      if (local_fc == 0) {
        puVar4 = Result<unsigned_int>::operator*((Result<unsigned_int> *)local_98);
        ParseModuleTypesCtx::getHeapTypeFromIdx
                  (&local_128,
                   (ParseModuleTypesCtx *)
                   oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int>,*puVar4);
        MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
        ::
        MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                  (__return_storage_ptr__,&local_128);
        Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>::
        ~Result(&local_128);
        local_fc = 1;
      }
      Result<unsigned_int>::~Result((Result<unsigned_int> *)local_98);
    }
    else {
      MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>::
      MaybeResult(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::HeapTypeT> maybeTypeidx(Ctx& ctx) {
  if (auto x = ctx.in.takeU32()) {
    return ctx.getHeapTypeFromIdx(*x);
  }
  if (auto id = ctx.in.takeID()) {
    // TODO: Fix position to point to start of id, not next element.
    auto idx = ctx.getTypeIndex(*id);
    CHECK_ERR(idx);
    return ctx.getHeapTypeFromIdx(*idx);
  }
  return {};
}